

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall re2::Prog::ConfigurePrefixAccel(Prog *this,string *prefix,bool prefix_foldcase)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  size_type sVar4;
  int b;
  long lVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  uint64_t *__s;
  undefined7 in_register_00000011;
  size_type sVar6;
  iterator __begin2;
  _Alloc_hider _Var7;
  ulong uVar8;
  ushort *puVar9;
  size_type sVar10;
  size_t dcurr;
  undefined8 uStack_280;
  ushort local_278 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  uint16_t nfa [256];
  
  this->prefix_foldcase_ = prefix_foldcase;
  uVar8 = prefix->_M_string_length;
  this->prefix_size_ = uVar8;
  if ((int)CONCAT71(in_register_00000011,prefix_foldcase) == 0) {
    *(int *)&this->field_11 = (int)*(prefix->_M_dataplus)._M_p;
    if (uVar8 != 1) {
      *(int *)((long)&this->field_11 + 4) =
           (int)(prefix->_M_dataplus)._M_p[prefix->_M_string_length - 1];
    }
  }
  else {
    if (8 < uVar8) {
      uVar8 = 9;
    }
    this->prefix_size_ = uVar8;
    sVar10 = 0;
    uStack_280 = 0x1e1753;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_258,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prefix,0,uVar8);
    sVar4 = local_258._M_string_length;
    uStack_280 = 0x1e1768;
    memset(nfa,0,0x200);
    _Var7._M_p = local_258._M_dataplus._M_p;
    while (sVar4 != sVar10) {
      pbVar1 = (byte *)(local_258._M_dataplus._M_p + sVar10);
      sVar10 = sVar10 + 1;
      nfa[*pbVar1] = nfa[*pbVar1] | (ushort)(1 << ((byte)sVar10 & 0x1f));
    }
    for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
      *(byte *)(nfa + lVar5) = (byte)nfa[lVar5] | 1;
    }
    local_278[4] = 0;
    local_278[5] = 0;
    local_278[6] = 0;
    local_278[7] = 0;
    local_278[8] = 0;
    local_278[9] = 0;
    local_278[0] = 1;
    local_278[1] = 0;
    local_278[2] = 0;
    local_278[3] = 0;
    for (sVar10 = 1; sVar10 - sVar4 != 1; sVar10 = sVar10 + 1) {
      sVar6 = sVar10;
      if (sVar10 == sVar4) {
        sVar6 = 9;
      }
      local_278[sVar6] =
           *(short *)((long)&uStack_280 + sVar10 * 2 + 6) * 2 + 1U &
           nfa[(byte)_Var7._M_p[sVar10 - 1]];
    }
    uStack_280 = 0x1e181e;
    std::
    __sort<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_less_iter>
              (_Var7._M_p,_Var7._M_p + sVar4);
    uStack_280 = 0x1e1830;
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (local_258._M_dataplus._M_p,
                         local_258._M_dataplus._M_p + local_258._M_string_length);
    uStack_280 = 0x1e1844;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&local_258,(__const_iterator)__first._M_current,
               (__const_iterator)(local_258._M_dataplus._M_p + local_258._M_string_length));
    uStack_280 = 0x1e184e;
    __s = (uint64_t *)operator_new__(0x800);
    uStack_280 = 0x1e1863;
    memset(__s,0,0x800);
    for (sVar10 = 0; sVar10 != sVar4; sVar10 = sVar10 + 1) {
      for (_Var7._M_p = local_258._M_dataplus._M_p;
          _Var7._M_p != local_258._M_dataplus._M_p + local_258._M_string_length;
          _Var7._M_p = _Var7._M_p + 1) {
        bVar2 = *_Var7._M_p;
        lVar5 = -6;
        puVar9 = local_278;
        do {
          lVar5 = lVar5 + 6;
          uVar3 = *puVar9;
          puVar9 = puVar9 + 1;
        } while (uVar3 != (local_278[sVar10] * 2 + 1 & nfa[bVar2]));
        uVar8 = lVar5 << ((char)sVar10 * '\x06' & 0x3fU);
        __s[bVar2] = __s[bVar2] | uVar8;
        if ((byte)(bVar2 + 0x9f) < 0x1a) {
          __s[(ulong)bVar2 - 0x20] = __s[(ulong)bVar2 - 0x20] | uVar8;
        }
      }
    }
    for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
      __s[lVar5] = __s[lVar5] | 0xd80000000000000;
    }
    (this->field_11).prefix_dfa_ = __s;
    uStack_280 = 0x1e1904;
    std::__cxx11::string::~string((string *)&local_258);
  }
  return;
}

Assistant:

void Prog::ConfigurePrefixAccel(const std::string& prefix,
                                bool prefix_foldcase) {
  prefix_foldcase_ = prefix_foldcase;
  prefix_size_ = prefix.size();
  if (prefix_foldcase_) {
    // Use PrefixAccel_ShiftDFA().
    // ... and no more than nine bytes of the prefix. (See above for details.)
    prefix_size_ = std::min(prefix_size_, kShiftDFAFinal);
    prefix_dfa_ = BuildShiftDFA(prefix.substr(0, prefix_size_));
  } else if (prefix_size_ != 1) {
    // Use PrefixAccel_FrontAndBack().
    prefix_front_ = prefix.front();
    prefix_back_ = prefix.back();
  } else {
    // Use memchr(3).
    prefix_front_ = prefix.front();
  }
}